

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

uint64_t get_ref_value(gen_ctx_t gen_ctx,MIR_op_t *ref_op)

{
  int iVar1;
  MIR_op_t *ref_op_local;
  gen_ctx_t gen_ctx_local;
  
  if ((*(ushort *)&ref_op->field_0x8 & 0xff) != 8) {
    __assert_fail("ref_op->mode == MIR_OP_REF",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x2f5,"uint64_t get_ref_value(gen_ctx_t, const MIR_op_t *)");
  }
  if (((((ref_op->u).ref)->item_type == MIR_data_item) &&
      (**(long **)((long)&((ref_op->u).label)->ops[0].u + 0x10) != 0)) &&
     (iVar1 = _MIR_reserved_ref_name_p
                        (gen_ctx->ctx,
                         (char *)**(undefined8 **)((long)&((ref_op->u).label)->ops[0].u + 0x10)),
     iVar1 != 0)) {
    return *(long *)((long)&((ref_op->u).label)->ops[0].u + 0x10) + 0x20;
  }
  return (uint64_t)((ref_op->u).ref)->addr;
}

Assistant:

static uint64_t get_ref_value (gen_ctx_t gen_ctx, const MIR_op_t *ref_op) {
  gen_assert (ref_op->mode == MIR_OP_REF);
  if (ref_op->u.ref->item_type == MIR_data_item && ref_op->u.ref->u.data->name != NULL
      && _MIR_reserved_ref_name_p (gen_ctx->ctx, ref_op->u.ref->u.data->name))
    return (uint64_t) ref_op->u.ref->u.data->u.els;
  return (uint64_t) ref_op->u.ref->addr;
}